

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upper_bound.cpp
# Opt level: O0

double __thiscall
despot::ParticleUpperBound::Value
          (ParticleUpperBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  size_type sVar2;
  const_reference ppSVar3;
  double extraout_XMM0_Qa;
  State *particle;
  double dStack_30;
  int i;
  double value;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  ParticleUpperBound *this_local;
  
  dStack_30 = 0.0;
  particle._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
    if (sVar2 <= (ulong)(long)particle._4_4_) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (particles,(long)particle._4_4_);
    dVar1 = (*ppSVar3)->weight;
    (*(this->super_ScenarioUpperBound)._vptr_ScenarioUpperBound[4])(this,*ppSVar3);
    dStack_30 = dVar1 * extraout_XMM0_Qa + dStack_30;
    particle._4_4_ = particle._4_4_ + 1;
  }
  return dStack_30;
}

Assistant:

double ParticleUpperBound::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	double value = 0;
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		value += particle->weight * Value(*particle);
	}
	return value;
}